

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprSynonymList(Fts5ExprTerm *pTerm,i64 iRowid,Fts5Buffer *pBuf,u8 **pa,int *pn)

{
  Fts5IndexIter *pFVar1;
  u8 *a;
  int iVar2;
  undefined8 *__dest;
  uint uVar3;
  undefined8 *puVar4;
  long lVar5;
  undefined8 *puVar6;
  i64 *piOff;
  long lVar7;
  ulong uVar8;
  Fts5PoslistWriter writer;
  Fts5PoslistReader aStatic [4];
  int local_f4;
  uint local_f0;
  Fts5PoslistWriter local_c0;
  undefined8 local_b8 [17];
  
  if (pTerm == (Fts5ExprTerm *)0x0) {
    puVar4 = local_b8;
    local_f4 = 0;
    uVar3 = 0;
  }
  else {
    local_f0 = 4;
    uVar3 = 0;
    local_f4 = 0;
    puVar6 = local_b8;
    do {
      pFVar1 = pTerm->pIter;
      puVar4 = puVar6;
      if ((pFVar1->bEof == '\0') && (pFVar1->iRowid == iRowid)) {
        if (pFVar1->nData == 0) {
          iVar2 = 4;
        }
        else {
          lVar7 = (long)(int)uVar3;
          if (uVar3 == local_f0) {
            iVar2 = sqlite3_initialize();
            if (iVar2 == 0) {
              __dest = (undefined8 *)sqlite3Malloc((long)(int)local_f0 << 6);
            }
            else {
              __dest = (undefined8 *)0x0;
            }
            if (__dest == (undefined8 *)0x0) {
              iVar2 = 5;
              local_f4 = 7;
            }
            else {
              memcpy(__dest,puVar6,lVar7 << 5);
              local_f0 = local_f0 * 2;
              iVar2 = 0;
              puVar4 = __dest;
              if (puVar6 != local_b8) {
                sqlite3_free(puVar6);
              }
            }
            if (__dest == (undefined8 *)0x0) goto LAB_001a7f42;
          }
          a = pFVar1->pData;
          iVar2 = pFVar1->nData;
          puVar6 = puVar4 + lVar7 * 4;
          *puVar6 = 0;
          puVar6[1] = 0;
          puVar6[2] = 0;
          puVar6[3] = 0;
          *puVar6 = a;
          *(int *)(puVar6 + 1) = iVar2;
          iVar2 = sqlite3Fts5PoslistNext64
                            (a,iVar2,(int *)((long)puVar6 + 0xc),puVar4 + lVar7 * 4 + 3);
          if (iVar2 != 0) {
            *(undefined1 *)((long)puVar4 + lVar7 * 0x20 + 0x11) = 1;
          }
          uVar3 = uVar3 + 1;
          iVar2 = 0;
        }
      }
      else {
        iVar2 = 0;
      }
LAB_001a7f42:
      if ((iVar2 != 0) && (iVar2 != 4)) {
        if (iVar2 != 5) {
          return local_f4;
        }
        goto LAB_001a8150;
      }
      pTerm = pTerm->pSynonym;
      puVar6 = puVar4;
    } while (pTerm != (Fts5ExprTerm *)0x0);
  }
  if (uVar3 != 1) {
    local_c0.iPrev = 0;
    pBuf->n = 0;
    lVar7 = -1;
    do {
      lVar5 = 0x7fffffffffffffff;
      if (0 < (int)uVar3) {
        lVar5 = 0x7fffffffffffffff;
        piOff = puVar4 + 3;
        uVar8 = (ulong)uVar3;
        do {
          if (*(char *)((long)piOff + -7) == '\0') {
            if (*piOff == lVar7) {
              iVar2 = sqlite3Fts5PoslistNext64
                                ((u8 *)piOff[-3],(int)piOff[-2],(int *)((long)piOff + -0xc),piOff);
              if (iVar2 != 0) {
                *(undefined1 *)((long)piOff + -7) = 1;
              }
              if (*(char *)((long)piOff + -7) != '\0') goto LAB_001a80e0;
            }
            if (*piOff < lVar5) {
              lVar5 = *piOff;
            }
          }
LAB_001a80e0:
          piOff = piOff + 4;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      lVar7 = lVar5;
      if (local_f4 != 0 || lVar7 == 0x7fffffffffffffff) goto code_r0x001a8123;
      local_f4 = sqlite3Fts5PoslistWriterAppend(pBuf,&local_c0,lVar7);
    } while( true );
  }
  *pa = (u8 *)*puVar4;
  *pn = *(int *)(puVar4 + 1);
LAB_001a8150:
  if (puVar4 != local_b8) {
    sqlite3_free(puVar4);
  }
  return local_f4;
code_r0x001a8123:
  if (local_f4 == 0) {
    *pa = pBuf->p;
    *pn = pBuf->n;
  }
  goto LAB_001a8150;
}

Assistant:

static int fts5ExprSynonymList(
  Fts5ExprTerm *pTerm, 
  i64 iRowid,
  Fts5Buffer *pBuf,               /* Use this buffer for space if required */
  u8 **pa, int *pn
){
  Fts5PoslistReader aStatic[4];
  Fts5PoslistReader *aIter = aStatic;
  int nIter = 0;
  int nAlloc = 4;
  int rc = SQLITE_OK;
  Fts5ExprTerm *p;

  assert( pTerm->pSynonym );
  for(p=pTerm; p; p=p->pSynonym){
    Fts5IndexIter *pIter = p->pIter;
    if( sqlite3Fts5IterEof(pIter)==0 && pIter->iRowid==iRowid ){
      if( pIter->nData==0 ) continue;
      if( nIter==nAlloc ){
        sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nAlloc * 2;
        Fts5PoslistReader *aNew = (Fts5PoslistReader*)sqlite3_malloc64(nByte);
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
          goto synonym_poslist_out;
        }
        memcpy(aNew, aIter, sizeof(Fts5PoslistReader) * nIter);
        nAlloc = nAlloc*2;
        if( aIter!=aStatic ) sqlite3_free(aIter);
        aIter = aNew;
      }
      sqlite3Fts5PoslistReaderInit(pIter->pData, pIter->nData, &aIter[nIter]);
      assert( aIter[nIter].bEof==0 );
      nIter++;
    }
  }

  if( nIter==1 ){
    *pa = (u8*)aIter[0].a;
    *pn = aIter[0].n;
  }else{
    Fts5PoslistWriter writer = {0};
    i64 iPrev = -1;
    fts5BufferZero(pBuf);
    while( 1 ){
      int i;
      i64 iMin = FTS5_LARGEST_INT64;
      for(i=0; i<nIter; i++){
        if( aIter[i].bEof==0 ){
          if( aIter[i].iPos==iPrev ){
            if( sqlite3Fts5PoslistReaderNext(&aIter[i]) ) continue;
          }
          if( aIter[i].iPos<iMin ){
            iMin = aIter[i].iPos;
          }
        }
      }
      if( iMin==FTS5_LARGEST_INT64 || rc!=SQLITE_OK ) break;
      rc = sqlite3Fts5PoslistWriterAppend(pBuf, &writer, iMin);
      iPrev = iMin;
    }
    if( rc==SQLITE_OK ){
      *pa = pBuf->p;
      *pn = pBuf->n;
    }
  }

 synonym_poslist_out:
  if( aIter!=aStatic ) sqlite3_free(aIter);
  return rc;
}